

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

char * rsa_ssh1_fingerprint(RSAKey *key)

{
  uint8_t uVar1;
  ssh_hash *psVar2;
  size_t sVar3;
  strbuf *buf_o;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  BinarySink *pBVar7;
  uchar digest [16];
  byte local_48 [24];
  
  psVar2 = md5_new(&ssh_md5);
  if (psVar2 != (ssh_hash *)0x0) {
    (*psVar2->vt->reset)(psVar2);
  }
  sVar3 = mp_get_nbits(key->modulus);
  if (7 < sVar3 + 7) {
    uVar6 = sVar3 + 7 >> 3;
    do {
      uVar6 = uVar6 - 1;
      pBVar7 = psVar2->binarysink_;
      uVar1 = mp_get_byte(key->modulus,uVar6);
      BinarySink_put_byte(pBVar7,uVar1);
    } while (uVar6 != 0);
  }
  sVar3 = mp_get_nbits(key->exponent);
  if (7 < sVar3 + 7) {
    uVar6 = sVar3 + 7 >> 3;
    do {
      uVar6 = uVar6 - 1;
      pBVar7 = psVar2->binarysink_;
      uVar1 = mp_get_byte(key->exponent,uVar6);
      BinarySink_put_byte(pBVar7,uVar1);
    } while (uVar6 != 0);
  }
  (*psVar2->vt->digest)(psVar2,local_48);
  (*psVar2->vt->free)(psVar2);
  buf_o = strbuf_new();
  pBVar7 = buf_o->binarysink_;
  sVar3 = mp_get_nbits(key->modulus);
  BinarySink_put_fmt(pBVar7,"%zu ",sVar3);
  lVar5 = 0;
  do {
    pcVar4 = ":";
    if (lVar5 == 0) {
      pcVar4 = "";
    }
    BinarySink_put_fmt(pBVar7,"%s%02x",pcVar4,(ulong)local_48[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  if (key->comment != (char *)0x0) {
    BinarySink_put_fmt(pBVar7," %s");
  }
  pcVar4 = strbuf_to_str(buf_o);
  return pcVar4;
}

Assistant:

char *rsa_ssh1_fingerprint(RSAKey *key)
{
    unsigned char digest[16];
    strbuf *out;
    int i;

    /*
     * The hash preimage for SSH-1 key fingerprinting consists of the
     * modulus and exponent _without_ any preceding length field -
     * just the minimum number of bytes to represent each integer,
     * stored big-endian, concatenated with no marker at the division
     * between them.
     */

    ssh_hash *hash = ssh_hash_new(&ssh_md5);
    for (size_t i = (mp_get_nbits(key->modulus) + 7) / 8; i-- > 0 ;)
        put_byte(hash, mp_get_byte(key->modulus, i));
    for (size_t i = (mp_get_nbits(key->exponent) + 7) / 8; i-- > 0 ;)
        put_byte(hash, mp_get_byte(key->exponent, i));
    ssh_hash_final(hash, digest);

    out = strbuf_new();
    put_fmt(out, "%"SIZEu" ", mp_get_nbits(key->modulus));
    for (i = 0; i < 16; i++)
        put_fmt(out, "%s%02x", i ? ":" : "", digest[i]);
    if (key->comment)
        put_fmt(out, " %s", key->comment);
    return strbuf_to_str(out);
}